

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O2

void __thiscall bdNode::addPeer(bdNode *this,bdId *id,uint32_t peerflags)

{
  bdFilter *this_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  bdPeer peer;
  sockaddr_in knownAddr;
  bdFriendEntry entry;
  
  this_00 = &this->mFilterPeers;
  iVar2 = bdFilter::checkPeer(this_00,id,peerflags);
  if (iVar2 == 0) {
    bdFriendEntry::bdFriendEntry(&entry);
    bVar1 = bdFriendList::findPeerEntry(&this->mFriendList,&id->id,&entry);
    if (bVar1) {
      uVar3 = bdFriendEntry::getPeerFlags(&entry);
      peerflags = uVar3 | peerflags;
      bVar1 = bdFriendEntry::addrKnown(&entry,&knownAddr);
      if ((bVar1) && (knownAddr.sin_addr.s_addr != (id->addr).sin_addr.s_addr)) {
        std::operator<<((ostream *)&std::cerr,"bdNode::addPeer(");
        (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,id);
        poVar4 = std::operator<<((ostream *)&std::cerr,", ");
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::operator<<((ostream *)&std::cerr,") MASQUERADING AS KNOWN PEER - FLAGGING AS BAD");
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        bdPeerQueue::queuePeer(&this->mBadPeerQueue,id,peerflags);
        bdFilter::addPeerToFilter(this_00,&id->addr,peerflags);
        peer.mPeerId.id.data[0] = '\0';
        peer.mPeerId.id.data[1] = '\0';
        peer.mPeerId.id.data[2] = '\0';
        peer.mPeerId.id.data[3] = '\0';
        peer.mPeerId.id.data[4] = '\0';
        peer.mPeerId.id.data[5] = '\0';
        peer.mPeerId.id.data[6] = '\0';
        peer.mPeerId.id.data[7] = '\0';
        peer.mPeerId.addr._0_8_ = &peer;
        peer.mPeerId.addr.sin_zero = (uchar  [8])&peer;
        bdFilter::filteredIPs(this_00,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer);
        bdStore::filterIpList
                  (&this->mStore,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer);
        bdSpace::flagpeer(&this->mNodeSpace,id,0,4);
        goto LAB_00114355;
      }
    }
    bdQueryManager::addPeer(this->mQueryMgr,id,peerflags);
    bdSpace::add_peer(&this->mNodeSpace,id,peerflags);
    bdPeer::bdPeer(&peer);
    peer.mPeerId.id.data._16_4_ = *(undefined4 *)((id->id).data + 0x10);
    peer.mPeerId.addr.sin_family = (id->addr).sin_family;
    peer.mPeerId.addr.sin_port = (id->addr).sin_port;
    peer.mPeerId.addr.sin_addr.s_addr = (id->addr).sin_addr.s_addr;
    peer.mPeerId.addr.sin_zero = *&(id->addr).sin_zero;
    peer.mPeerId.id.data._0_8_ = *(undefined8 *)(id->id).data;
    peer.mPeerId.id.data._8_8_ = *(undefined8 *)((id->id).data + 8);
    peer.mPeerFlags = peerflags;
    peer.mLastRecvTime = time((time_t *)0x0);
    bdStore::addStore(&this->mStore,&peer);
    bdConnectManager::updatePotentialConnectionProxy(this->mConnMgr,id,peerflags);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"bdNode::addPeer(");
    (*this->mFns->_vptr_bdDhtFunctions[10])(this->mFns,&std::cerr,id);
    poVar4 = std::operator<<((ostream *)&std::cerr,", ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::operator<<((ostream *)&std::cerr,") FAILED the BAD PEER FILTER!!!! DISCARDING MSG");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    peer.mPeerId.id.data[0] = '\0';
    peer.mPeerId.id.data[1] = '\0';
    peer.mPeerId.id.data[2] = '\0';
    peer.mPeerId.id.data[3] = '\0';
    peer.mPeerId.id.data[4] = '\0';
    peer.mPeerId.id.data[5] = '\0';
    peer.mPeerId.id.data[6] = '\0';
    peer.mPeerId.id.data[7] = '\0';
    peer.mPeerId.addr._0_8_ = &peer;
    peer.mPeerId.addr.sin_zero = (uchar  [8])&peer;
    bdFilter::filteredIPs(this_00,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer);
    bdStore::filterIpList(&this->mStore,(list<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer);
    bdPeerQueue::queuePeer(&this->mBadPeerQueue,id,peerflags);
LAB_00114355:
    std::__cxx11::_List_base<sockaddr_in,_std::allocator<sockaddr_in>_>::_M_clear
              ((_List_base<sockaddr_in,_std::allocator<sockaddr_in>_> *)&peer);
  }
  return;
}

Assistant:

void bdNode::addPeer(const bdId *id, uint32_t peerflags) {

#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdNode::addPeer(");
	mFns->bdPrintId(std::cerr, id);
	fprintf(stderr, ")\n");
#endif

	/* first check the filters */
    if (mFilterPeers.checkPeer(id, peerflags)) {
		std::cerr << "bdNode::addPeer(";
		mFns->bdPrintId(std::cerr, id);
		std::cerr << ", " << std::hex << peerflags << std::dec;
		std::cerr << ") FAILED the BAD PEER FILTER!!!! DISCARDING MSG";
		std::cerr << std::endl;

		std::list<struct sockaddr_in> filteredIPs;
        mFilterPeers.filteredIPs(filteredIPs);
		mStore.filterIpList(filteredIPs);

        mBadPeerQueue.queuePeer(id, peerflags);

		return;
	}

	/* next we check if it is a friend, whitelist etc, and adjust flags */
	bdFriendEntry entry;

	if (mFriendList.findPeerEntry(&(id->id), entry)) {
		/* found! */
		peerflags |= entry.getPeerFlags(); // translates internal into general ones.

		struct sockaddr_in knownAddr;
		if (entry.addrKnown(&knownAddr))
			if (knownAddr.sin_addr.s_addr != id->addr.sin_addr.s_addr) {
#ifndef DISABLE_BAD_PEER_FILTER	
				std::cerr << "bdNode::addPeer(";
				mFns->bdPrintId(std::cerr, id);
				std::cerr << ", " << std::hex << peerflags << std::dec;
				std::cerr << ") MASQUERADING AS KNOWN PEER - FLAGGING AS BAD";
				std::cerr << std::endl;
				
				// Stores in queue for later callback and desemination around the network.
                mBadPeerQueue.queuePeer(id, peerflags);

                mFilterPeers.addPeerToFilter(id->addr, peerflags);

				std::list<struct sockaddr_in> filteredIPs;
                mFilterPeers.filteredIPs(filteredIPs);
				mStore.filterIpList(filteredIPs);

				// DO WE EXPLICITLY NEED TO DO THIS, OR WILL THEY JUST BE DROPPED?
				//mNodeSpace.remove_badpeer(id);
				//mQueryMgr->remove_badpeer(id);
	
				// FLAG in NodeSpace (Should be dropped very quickly anyway)
				mNodeSpace.flagpeer(id, 0, BITDHT_PEER_EXFLAG_BADPEER);
				return;
#endif
			}
	}

	mQueryMgr->addPeer(id, peerflags);
	mNodeSpace.add_peer(id, peerflags);

	bdPeer peer;
	peer.mPeerId = *id;
	peer.mPeerFlags = peerflags;
	peer.mLastRecvTime = time(NULL);
	mStore.addStore(&peer);

	// Finally we pass to connections for them to use.
	mConnMgr->updatePotentialConnectionProxy(id, peerflags);


//#define DISPLAY_BITDHTNODES	1
#ifdef DISPLAY_BITDHTNODES
	/* TEMP to extract IDS for BloomFilter */
	if (peerflags & BITDHT_PEER_STATUS_DHT_ENGINE) {
		std::cerr << "bdNode::addPeer() FOUND BITDHT PEER";
		std::cerr << std::endl;
		mFns->bdPrintNodeId(std::cerr, &(id->id));
		std::cerr << std::endl;
	}
#endif
}